

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag.cc
# Opt level: O0

int64_t __thiscall absl::lts_20240722::flags_internal::FlagImpl::ReadOneWord(FlagImpl *this)

{
  FlagValueStorageKind FVar1;
  atomic<long> *paVar2;
  bool bVar3;
  Mutex *guard;
  FlagImpl *this_local;
  memory_order __b;
  
  FVar1 = ValueStorageKind(this);
  bVar3 = true;
  if (FVar1 != kOneWordAtomic) {
    FVar1 = ValueStorageKind(this);
    bVar3 = FVar1 == kValueAndInitBit;
  }
  if (bVar3) {
    DataGuard(this);
    paVar2 = OneWordValue(this);
    std::operator&(memory_order_acquire,__memory_order_mask);
    return (paVar2->super___atomic_base<long>)._M_i;
  }
  __assert_fail("ValueStorageKind() == FlagValueStorageKind::kOneWordAtomic || ValueStorageKind() == FlagValueStorageKind::kValueAndInitBit"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/flags/internal/flag.cc"
                ,0x230,"int64_t absl::flags_internal::FlagImpl::ReadOneWord() const");
}

Assistant:

int64_t FlagImpl::ReadOneWord() const {
  assert(ValueStorageKind() == FlagValueStorageKind::kOneWordAtomic ||
         ValueStorageKind() == FlagValueStorageKind::kValueAndInitBit);
  auto* guard = DataGuard();  // Make sure flag initialized
  (void)guard;
  return OneWordValue().load(std::memory_order_acquire);
}